

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O2

bool __thiscall llvm::sys::SmartMutex<true>::lock(SmartMutex<true> *this)

{
  bool bVar1;
  
  bVar1 = llvm_is_multithreaded();
  if (bVar1) {
    bVar1 = MutexImpl::acquire(&this->impl);
    return bVar1;
  }
  if ((this->acquired == 0 | this->recursive) == 1) {
    this->acquired = this->acquired + 1;
    return true;
  }
  __assert_fail("(recursive || acquired == 0) && \"Lock already acquired!!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Mutex.h"
                ,0x6b,"bool llvm::sys::SmartMutex<true>::lock() [mt_only = true]");
}

Assistant:

bool lock() {
        if (!mt_only || llvm_is_multithreaded()) {
          return impl.acquire();
        } else {
          // Single-threaded debugging code.  This would be racy in
          // multithreaded mode, but provides not sanity checks in single
          // threaded mode.
          assert((recursive || acquired == 0) && "Lock already acquired!!");
          ++acquired;
          return true;
        }
      }